

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MathFuncs.cpp
# Opt level: O0

void __thiscall
slang::ast::builtins::RealMath2Function<&pow>::~RealMath2Function(RealMath2Function<&pow> *this)

{
  RealMath2Function<&pow> *this_local;
  
  ~RealMath2Function(this);
  operator_delete(this,0x68);
  return;
}

Assistant:

RealMath2Function(Compilation& comp, const std::string& name) :
        SimpleSystemSubroutine(name, SubroutineKind::Function, 2,
                               {&comp.getRealType(), &comp.getRealType()}, comp.getRealType(),
                               false) {}